

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O0

void __thiscall picobench::benchmark::benchmark(benchmark *this,char *name,benchmark_proc proc)

{
  benchmark_proc proc_local;
  char *name_local;
  benchmark *this_local;
  
  this->_name = name;
  this->_proc = proc;
  this->_baseline = false;
  this->_user_data = 0;
  std::vector<int,_std::allocator<int>_>::vector(&this->_state_iterations);
  this->_samples = 0;
  return;
}

Assistant:

benchmark::benchmark(const char* name, benchmark_proc proc)
    : _name(name)
    , _proc(proc)
{}